

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcElementType::~IfcElementType(IfcElementType *this)

{
  ~IfcElementType((IfcElementType *)&this[-1].super_IfcTypeProduct.super_IfcTypeObject.field_0x50);
  return;
}

Assistant:

IfcElementType() : Object("IfcElementType") {}